

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

Transliterator * icu_63::Transliterator::createBasicInstance(UnicodeString *id,UnicodeString *canon)

{
  Transliterator *pTVar1;
  UBool UVar2;
  TransliteratorParser *this;
  UParseError *pe_00;
  undefined1 local_278 [8];
  TransliteratorParser parser;
  Transliterator *t;
  TransliteratorAlias *alias;
  undefined1 local_68 [4];
  UErrorCode ec;
  UParseError pe;
  UnicodeString *canon_local;
  UnicodeString *id_local;
  
  alias._4_4_ = U_ZERO_ERROR;
  t = (Transliterator *)0x0;
  parser.dotStandIn = L'\0';
  parser._498_6_ = 0;
  pe.postContext._24_8_ = canon;
  umtx_lock_63(&registryMutex);
  if ((registry != (TransliteratorRegistry *)0x0) ||
     (UVar2 = initializeRegistry((UErrorCode *)((long)&alias + 4)), UVar2 != '\0')) {
    canon = id;
    parser._496_8_ =
         TransliteratorRegistry::get
                   (registry,id,(TransliteratorAlias **)&t,(UErrorCode *)((long)&alias + 4));
  }
  umtx_unlock_63(&registryMutex);
  UVar2 = ::U_FAILURE(alias._4_4_);
  if (UVar2 == '\0') {
    do {
      if (t == (Transliterator *)0x0) goto LAB_002e29e0;
      UVar2 = TransliteratorAlias::isRuleBased((TransliteratorAlias *)t);
      if (UVar2 == '\0') {
        pe_00 = (UParseError *)local_68;
        parser._496_8_ =
             TransliteratorAlias::create
                       ((TransliteratorAlias *)t,pe_00,(UErrorCode *)((long)&alias + 4));
        pTVar1 = t;
        if (t != (Transliterator *)0x0) {
          TransliteratorAlias::~TransliteratorAlias((TransliteratorAlias *)t);
          UMemory::operator_delete((UMemory *)pTVar1,pe_00);
        }
        t = (Transliterator *)0x0;
        goto LAB_002e29e0;
      }
      this = (TransliteratorParser *)local_278;
      TransliteratorParser::TransliteratorParser(this,(UErrorCode *)((long)&alias + 4));
      TransliteratorAlias::parse
                ((TransliteratorAlias *)t,this,(UParseError *)local_68,
                 (UErrorCode *)((long)&alias + 4));
      pTVar1 = t;
      if (t != (Transliterator *)0x0) {
        TransliteratorAlias::~TransliteratorAlias((TransliteratorAlias *)t);
        UMemory::operator_delete((UMemory *)pTVar1,this);
      }
      t = (Transliterator *)0x0;
      umtx_lock_63(&registryMutex);
      if ((registry != (TransliteratorRegistry *)0x0) ||
         (UVar2 = initializeRegistry((UErrorCode *)((long)&alias + 4)), UVar2 != '\0')) {
        this = (TransliteratorParser *)id;
        parser._496_8_ =
             TransliteratorRegistry::reget
                       (registry,id,(TransliteratorParser *)local_278,(TransliteratorAlias **)&t,
                        (UErrorCode *)((long)&alias + 4));
      }
      umtx_unlock_63(&registryMutex);
      TransliteratorParser::~TransliteratorParser((TransliteratorParser *)local_278);
      UVar2 = ::U_FAILURE(alias._4_4_);
    } while (UVar2 == '\0');
    if (parser._496_8_ != 0) {
      (**(code **)(*(long *)parser._496_8_ + 8))();
    }
    pTVar1 = t;
    if (t != (Transliterator *)0x0) {
      TransliteratorAlias::~TransliteratorAlias((TransliteratorAlias *)t);
      UMemory::operator_delete((UMemory *)pTVar1,this);
    }
    parser.dotStandIn = L'\0';
    parser._498_6_ = 0;
LAB_002e29e0:
    if ((parser._496_8_ != 0) && (pe.postContext._24_8_ != 0)) {
      setID((Transliterator *)parser._496_8_,(UnicodeString *)pe.postContext._24_8_);
    }
    id_local = (UnicodeString *)parser._496_8_;
  }
  else {
    if (parser._496_8_ != 0) {
      (**(code **)(*(long *)parser._496_8_ + 8))();
    }
    pTVar1 = t;
    if (t != (Transliterator *)0x0) {
      TransliteratorAlias::~TransliteratorAlias((TransliteratorAlias *)t);
      UMemory::operator_delete((UMemory *)pTVar1,canon);
    }
    id_local = (UnicodeString *)0x0;
  }
  return (Transliterator *)id_local;
}

Assistant:

Transliterator* Transliterator::createBasicInstance(const UnicodeString& id,
                                                    const UnicodeString* canon) {
    UParseError pe;
    UErrorCode ec = U_ZERO_ERROR;
    TransliteratorAlias* alias = 0;
    Transliterator* t = 0;

    umtx_lock(&registryMutex);
    if (HAVE_REGISTRY(ec)) {
        t = registry->get(id, alias, ec);
    }
    umtx_unlock(&registryMutex);

    if (U_FAILURE(ec)) {
        delete t;
        delete alias;
        return 0;
    }

    // We may have not gotten a transliterator:  Because we can't
    // instantiate a transliterator from inside TransliteratorRegistry::
    // get() (that would deadlock), we sometimes pass back an alias.  This
    // contains the data we need to finish the instantiation outside the
    // registry mutex.  The alias may, in turn, generate another alias, so
    // we handle aliases in a loop.  The max times through the loop is two.
    // [alan]
    while (alias != 0) {
        U_ASSERT(t==0);
        // Rule-based aliases are handled with TransliteratorAlias::
        // parse(), followed by TransliteratorRegistry::reget().
        // Other aliases are handled with TransliteratorAlias::create().
        if (alias->isRuleBased()) {
            // Step 1. parse
            TransliteratorParser parser(ec);
            alias->parse(parser, pe, ec);
            delete alias;
            alias = 0;

            // Step 2. reget
            umtx_lock(&registryMutex);
            if (HAVE_REGISTRY(ec)) {
                t = registry->reget(id, parser, alias, ec);
            }
            umtx_unlock(&registryMutex);

            // Step 3. Loop back around!
        } else {
            t = alias->create(pe, ec);
            delete alias;
            alias = 0;
            break;
        }
        if (U_FAILURE(ec)) {
            delete t;
            delete alias;
            t = NULL;
            break;
        }
    }

    if (t != NULL && canon != NULL) {
        t->setID(*canon);
    }

    return t;
}